

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O1

int LS_Thing_SetGoal(line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,
                    int arg4)

{
  AActor *pAVar1;
  AActor *pAVar2;
  AActor *pAVar3;
  AActor *pAVar4;
  int iVar5;
  NActorIterator goaliterator;
  FName local_54;
  TActorIterator<AActor> local_50;
  NActorIterator local_40;
  
  iVar5 = 0;
  local_50.super_FActorIterator.base = (AActor *)0x0;
  local_40.super_FActorIterator.base = (AActor *)0x0;
  local_54.Index = 0x105;
  local_50.super_FActorIterator.id = arg0;
  local_40.super_FActorIterator.id = arg1;
  local_40.type = PClass::FindClass(&local_54);
  pAVar1 = NActorIterator::Next(&local_40);
  pAVar2 = TActorIterator<AActor>::Next(&local_50);
  if (pAVar2 != (AActor *)0x0) {
    do {
      if (((pAVar2->flags).Value & 4) != 0) {
        pAVar3 = (pAVar2->goal).field_0.p;
        if ((pAVar3 != (AActor *)0x0) &&
           (((pAVar3->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
          (pAVar2->goal).field_0.p = (AActor *)0x0;
          pAVar3 = (AActor *)0x0;
        }
        pAVar4 = (pAVar2->target).field_0.p;
        if ((pAVar4 != (AActor *)0x0) &&
           (((pAVar4->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
          (pAVar2->target).field_0.p = (AActor *)0x0;
          pAVar4 = (AActor *)0x0;
        }
        if (pAVar4 == pAVar3) {
          (pAVar2->target).field_0.p = (AActor *)0x0;
        }
        (pAVar2->goal).field_0.p = pAVar1;
        (pAVar2->flags5).Value = (pAVar2->flags5).Value & 0xffffff7f | (uint)(arg3 != 0) << 7;
        pAVar3 = (pAVar2->target).field_0.p;
        if (pAVar3 != (AActor *)0x0) {
          if (((pAVar3->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) goto LAB_0050a534;
          (pAVar2->target).field_0.p = (AActor *)0x0;
        }
        pAVar2->reactiontime = arg2 * 0x23;
      }
LAB_0050a534:
      pAVar2 = TActorIterator<AActor>::Next(&local_50);
    } while (pAVar2 != (AActor *)0x0);
    iVar5 = 1;
  }
  return iVar5;
}

Assistant:

FUNC(LS_Thing_SetGoal)
// Thing_SetGoal (tid, goal, delay, chasegoal)
{
	TActorIterator<AActor> selfiterator (arg0);
	NActorIterator goaliterator (NAME_PatrolPoint, arg1);
	AActor *self;
	AActor *goal = goaliterator.Next ();
	bool ok = false;

	while ( (self = selfiterator.Next ()) )
	{
		ok = true;
		if (self->flags & MF_SHOOTABLE)
		{
			if (self->target == self->goal)
			{ // Targeting a goal already? -> don't target it anymore.
			  // A_Look will set it to the goal, presuming no real targets
			  // come into view by then.
				self->target = NULL;
			}
			self->goal = goal;
			if (arg3 == 0)
			{
				self->flags5 &= ~MF5_CHASEGOAL;
			}
			else
			{
				self->flags5 |= MF5_CHASEGOAL;
			}
			if (self->target == NULL)
			{
				self->reactiontime = arg2 * TICRATE;
			}
		}
	}

	return ok;
}